

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transition.cc
# Opt level: O3

bool tchecker::syncprod::operator==(transition_t *t1,transition_t *t2)

{
  uint uVar1;
  make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL> *pmVar2;
  make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL> *pmVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  
  if (t1->_sync_id == t2->_sync_id) {
    pmVar2 = (t1->_vedge)._t;
    if ((pmVar2 == (make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL> *)0x0) ||
       (pmVar3 = (t2->_vedge)._t,
       pmVar3 == (make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL> *)0x0)) {
      __assert_fail("_t != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                    ,0x1d0,
                    "T &tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t>>::operator*() const [T = tchecker::make_shared_t<tchecker::vedge_t>]"
                   );
    }
    uVar1 = (pmVar2->super_vedge_t).super_edge_array_t.super_vedge_base_t.
            super_array_capacity_t<unsigned_int>._capacity;
    if (uVar1 == (pmVar3->super_vedge_t).super_edge_array_t.super_vedge_base_t.
                 super_array_capacity_t<unsigned_int>._capacity) {
      if ((ulong)uVar1 == 0) {
        return true;
      }
      lVar4 = 4;
      while( true ) {
        bVar5 = *(int *)((long)&(pmVar2->super_vedge_t).super_edge_array_t.super_vedge_base_t.
                                super_array_capacity_t<unsigned_int>._capacity + lVar4) ==
                *(int *)((long)&(pmVar3->super_vedge_t).super_edge_array_t.super_vedge_base_t.
                                super_array_capacity_t<unsigned_int>._capacity + lVar4);
        if (!bVar5) {
          return bVar5;
        }
        bVar6 = (ulong)uVar1 << 2 == lVar4;
        if (bVar6) break;
        lVar4 = lVar4 + 4;
        if (bVar6) {
          return bVar5;
        }
      }
      return bVar5;
    }
  }
  return false;
}

Assistant:

bool operator==(tchecker::syncprod::transition_t const & t1, tchecker::syncprod::transition_t const & t2)
{
  return (static_cast<tchecker::ts::transition_t const &>(t1) == static_cast<tchecker::ts::transition_t const &>(t2) &&
          (t1.sync_id() == t2.sync_id()) && (t1.vedge() == t2.vedge()));
}